

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URDFParsingUtils.h
# Opt level: O2

bool iDynTree::vector4FromString(string *vector_str,Vector4 *out)

{
  bool bVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t inInt;
  uint uVar2;
  ulong uVar3;
  vector<double,_std::allocator<double>_> rgba;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pieces;
  string errStr;
  double newDouble;
  _Vector_base<double,_std::allocator<double>_> local_118;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  string *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_118._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = vector_str;
  splitString(vector_str,&local_f8);
  uVar2 = 0;
  inInt = extraout_RDX;
  do {
    uVar3 = (ulong)uVar2;
    if ((ulong)((long)local_f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_f8.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar3) {
      if ((long)local_118._M_impl.super__Vector_impl_data._M_finish -
          (long)local_118._M_impl.super__Vector_impl_data._M_start == 0x20) {
        out->m_data[0] = *local_118._M_impl.super__Vector_impl_data._M_start;
        out->m_data[1] = local_118._M_impl.super__Vector_impl_data._M_start[1];
        out->m_data[2] = local_118._M_impl.super__Vector_impl_data._M_start[2];
        out->m_data[3] = local_118._M_impl.super__Vector_impl_data._M_start[3];
        bVar1 = true;
      }
      else {
        intToString_abi_cxx11_
                  (&local_70,
                   (iDynTree *)
                   ((long)local_118._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_118._M_impl.super__Vector_impl_data._M_start >> 3),inInt);
        std::operator+(&local_50,"Parser found ",&local_70);
        std::operator+(&local_90,&local_50," elements but 4 expected while parsing vector [");
        std::operator+(&local_d0,&local_90,local_d8);
        std::operator+(&local_b0,&local_d0,"]");
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        iDynTree::reportError("","vector4FromString",local_b0._M_dataplus._M_p);
LAB_0014087d:
        std::__cxx11::string::~string((string *)&local_b0);
        bVar1 = false;
      }
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_118);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_f8);
      return bVar1;
    }
    bVar1 = std::operator!=(local_f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar3,"");
    inInt = extraout_RDX_00;
    if (bVar1) {
      bVar1 = stringToDoubleWithClassicLocale
                        (local_f8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar3,(double *)&local_90);
      if (!bVar1) {
        std::operator+(&local_d0,"Unable to parse component [",
                       local_f8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar3);
        std::operator+(&local_b0,&local_d0,"] to a double (while parsing a vector value)");
        std::__cxx11::string::~string((string *)&local_d0);
        iDynTree::reportError("","vector4FromString",local_b0._M_dataplus._M_p);
        goto LAB_0014087d;
      }
      std::vector<double,_std::allocator<double>_>::push_back
                ((vector<double,_std::allocator<double>_> *)&local_118,
                 (value_type_conflict2 *)&local_90);
      inInt = extraout_RDX_01;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

bool inline vector4FromString(const std::string & vector_str, Vector4 & out)
{
    std::vector<std::string> pieces;
    std::vector<double> rgba;
    splitString(vector_str,pieces);
    for (unsigned int i = 0; i < pieces.size(); ++i)
    {
      if (pieces[i] != ""){
       double newDouble;
       if( stringToDoubleWithClassicLocale(pieces[i],newDouble) )
       {
          rgba.push_back(newDouble);
       }
       else
       {
           std::string errStr = "Unable to parse component [" + pieces[i] + "] to a double (while parsing a vector value)";
           reportError("","vector4FromString",errStr.c_str());
           return false;
       }
      }
    }

    if (rgba.size() != 4)
    {
        std::string errStr = "Parser found " + intToString(rgba.size())  + " elements but 4 expected while parsing vector [" + vector_str + "]";
        reportError("","vector4FromString",errStr.c_str());
        return false;
    }

    out(0) = rgba[0];
    out(1) = rgba[1];
    out(2) = rgba[2];
    out(3) = rgba[3];

    return true;
}